

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O0

void __thiscall
string_assertion_test::iu_StrTest_x_iutest_x_NeString_Test<char16_t>::Body
          (iu_StrTest_x_iutest_x_NeString_Test<char16_t> *this)

{
  undefined *puVar1;
  bool bVar2;
  char *pcVar3;
  type **in_stack_ffffffffffffeca8;
  Fixed *this_00;
  AssertionHelper local_12d8;
  Fixed local_12a8;
  u16string local_1120 [32];
  undefined1 local_1100 [8];
  AssertionResult iutest_ar_8;
  Fixed local_10a8;
  u16string local_f20 [32];
  undefined1 local_f00 [8];
  AssertionResult iutest_ar_7;
  AssertionHelper local_ed0;
  Fixed local_ea0;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_d18;
  u16string local_cf8 [32];
  undefined1 local_cd8 [8];
  AssertionResult iutest_ar_6;
  Fixed local_c80;
  u16string local_af8 [32];
  undefined1 local_ad8 [8];
  AssertionResult iutest_ar_5;
  Fixed local_a80;
  u16string local_8f8 [32];
  undefined1 local_8d8 [8];
  AssertionResult iutest_ar_4;
  Fixed local_880;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_6f8;
  u16string local_6d8 [32];
  undefined1 local_6b8 [8];
  AssertionResult iutest_ar_3;
  Fixed local_660;
  u16string local_4d8 [32];
  undefined1 local_4b8 [8];
  AssertionResult iutest_ar_2;
  Fixed local_460;
  u16string local_2d8 [32];
  undefined1 local_2b8 [8];
  AssertionResult iutest_ar_1;
  Fixed local_260;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_d8;
  u16string local_b8 [32];
  undefined1 local_98 [8];
  AssertionResult iutest_ar;
  undefined1 local_68 [8];
  String Test;
  allocator<char16_t> local_31;
  undefined1 local_30 [8];
  String test;
  iu_StrTest_x_iutest_x_NeString_Test<char16_t> *this_local;
  
  puVar1 = text<char16_t>::test;
  test.field_2._8_8_ = this;
  std::allocator<char16_t>::allocator(&local_31);
  std::__cxx11::u16string::u16string<std::allocator<char16_t>>
            ((u16string *)local_30,(char16_t *)puVar1,&local_31);
  std::allocator<char16_t>::~allocator(&local_31);
  puVar1 = text<char16_t>::Test;
  std::allocator<char16_t>::allocator((allocator<char16_t> *)&iutest_ar.field_0x27);
  std::__cxx11::u16string::u16string<std::allocator<char16_t>>
            ((u16string *)local_68,(char16_t *)puVar1,(allocator<char16_t> *)&iutest_ar.field_0x27);
  std::allocator<char16_t>::~allocator((allocator<char16_t> *)&iutest_ar.field_0x27);
  iutest::detail::AlwaysZero();
  std::__cxx11::u16string::u16string
            (local_b8,(basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                       *)local_30);
  std::__cxx11::u16string::u16string
            ((u16string *)&local_d8,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             local_68);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::u16string,std::__cxx11::u16string>
            ((AssertionResult *)local_98,(internal *)0x546722,"Test",(char *)local_b8,&local_d8,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeca8);
  std::__cxx11::u16string::~u16string((u16string *)&local_d8);
  std::__cxx11::u16string::~u16string(local_b8);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar2) {
    memset(&local_260,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_260);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_98);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x87,pcVar3,kWarning);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_260);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_260);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  iutest::detail::AlwaysZero();
  puVar1 = text<char16_t>::test;
  std::__cxx11::u16string::u16string
            (local_2d8,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             local_68);
  iutest::internal::CmpHelperSTRNE<char16_t_const*,std::__cxx11::u16string>
            ((AssertionResult *)local_2b8,(internal *)"TestFixture::Text::test","Test",puVar1,
             (char16_t *)local_2d8,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeca8);
  std::__cxx11::u16string::~u16string(local_2d8);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar2) {
    memset(&local_460,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_460);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_2b8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_2.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x88,pcVar3,kWarning);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_460);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_460);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  iutest::detail::AlwaysZero();
  std::__cxx11::u16string::u16string
            (local_4d8,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             local_30);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::u16string,char16_t_const*>
            ((AssertionResult *)local_4b8,(internal *)0x546722,"TestFixture::Text::Test",
             (char *)local_4d8,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             text<char16_t>::Test,(char16_t *)&iutest_type_traits::enabler_t<void>::value,
             in_stack_ffffffffffffeca8);
  std::__cxx11::u16string::~u16string(local_4d8);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar2) {
    memset(&local_660,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_660);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_4b8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_3.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x89,pcVar3,kWarning);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_3.m_result,&local_660);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_660);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  iutest::detail::AlwaysZero();
  std::__cxx11::u16string::u16string
            (local_6d8,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             local_30);
  std::__cxx11::u16string::u16string
            ((u16string *)&local_6f8,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             local_68);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::u16string,std::__cxx11::u16string>
            ((AssertionResult *)local_6b8,(internal *)0x546722,"Test",(char *)local_6d8,&local_6f8,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeca8);
  std::__cxx11::u16string::~u16string((u16string *)&local_6f8);
  std::__cxx11::u16string::~u16string(local_6d8);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
  if (!bVar2) {
    memset(&local_880,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_880);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_6b8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_4.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x8b,pcVar3,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_4.m_result,&local_880);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_4.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_880);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
  iutest::detail::AlwaysZero();
  puVar1 = text<char16_t>::test;
  std::__cxx11::u16string::u16string
            (local_8f8,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             local_68);
  iutest::internal::CmpHelperSTRNE<char16_t_const*,std::__cxx11::u16string>
            ((AssertionResult *)local_8d8,(internal *)"TestFixture::Text::test","Test",puVar1,
             (char16_t *)local_8f8,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeca8);
  std::__cxx11::u16string::~u16string(local_8f8);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d8);
  if (!bVar2) {
    memset(&local_a80,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_a80);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_8d8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_5.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x8c,pcVar3,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_5.m_result,&local_a80);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_5.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_a80);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_8d8);
  iutest::detail::AlwaysZero();
  std::__cxx11::u16string::u16string
            (local_af8,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             local_30);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::u16string,char16_t_const*>
            ((AssertionResult *)local_ad8,(internal *)0x546722,"TestFixture::Text::Test",
             (char *)local_af8,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             text<char16_t>::Test,(char16_t *)&iutest_type_traits::enabler_t<void>::value,
             in_stack_ffffffffffffeca8);
  std::__cxx11::u16string::~u16string(local_af8);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ad8);
  if (!bVar2) {
    memset(&local_c80,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_c80);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_ad8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_6.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x8d,pcVar3,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_6.m_result,&local_c80);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_6.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_c80);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_ad8);
  iutest::detail::AlwaysZero();
  std::__cxx11::u16string::u16string
            (local_cf8,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             local_30);
  std::__cxx11::u16string::u16string
            ((u16string *)&local_d18,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             local_68);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::u16string,std::__cxx11::u16string>
            ((AssertionResult *)local_cd8,(internal *)0x546722,"Test",(char *)local_cf8,&local_d18,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeca8);
  std::__cxx11::u16string::~u16string((u16string *)&local_d18);
  std::__cxx11::u16string::~u16string(local_cf8);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cd8);
  if (!bVar2) {
    memset(&local_ea0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_ea0);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_cd8);
    iutest::AssertionHelper::AssertionHelper
              (&local_ed0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x8f,pcVar3,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_ed0,&local_ea0);
    iutest::AssertionHelper::~AssertionHelper(&local_ed0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_ea0);
  }
  iutest_ar_7._37_3_ = 0;
  iutest_ar_7._36_1_ = !bVar2;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_cd8);
  if (iutest_ar_7._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    puVar1 = text<char16_t>::test;
    std::__cxx11::u16string::u16string
              (local_f20,
               (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
               local_68);
    iutest::internal::CmpHelperSTRNE<char16_t_const*,std::__cxx11::u16string>
              ((AssertionResult *)local_f00,(internal *)"TestFixture::Text::test","Test",puVar1,
               (char16_t *)local_f20,
               (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
               &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeca8);
    std::__cxx11::u16string::~u16string(local_f20);
    bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f00);
    if (!bVar2) {
      memset(&local_10a8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_10a8);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_f00);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_8.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
                 ,0x90,pcVar3,kFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_8.m_result,&local_10a8);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_8.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_10a8);
    }
    iutest_ar_7._37_3_ = 0;
    iutest_ar_7._36_1_ = !bVar2;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_f00);
    if (iutest_ar_7._36_4_ == 0) {
      iutest::detail::AlwaysZero();
      std::__cxx11::u16string::u16string
                (local_1120,
                 (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
                 local_30);
      iutest::internal::CmpHelperSTRNE<std::__cxx11::u16string,char16_t_const*>
                ((AssertionResult *)local_1100,(internal *)0x546722,"TestFixture::Text::Test",
                 (char *)local_1120,
                 (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
                 text<char16_t>::Test,(char16_t *)&iutest_type_traits::enabler_t<void>::value,
                 in_stack_ffffffffffffeca8);
      std::__cxx11::u16string::~u16string(local_1120);
      bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1100);
      if (!bVar2) {
        this_00 = &local_12a8;
        memset(this_00,0,0x188);
        iutest::AssertionHelper::Fixed::Fixed(this_00);
        pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_1100);
        iutest::AssertionHelper::AssertionHelper
                  (&local_12d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
                   ,0x91,pcVar3,kFatalFailure);
        iutest::AssertionHelper::operator=(&local_12d8,&local_12a8);
        iutest::AssertionHelper::~AssertionHelper(&local_12d8);
        iutest::AssertionHelper::Fixed::~Fixed(&local_12a8);
      }
      iutest_ar_7._37_3_ = 0;
      iutest_ar_7._36_1_ = !bVar2;
      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1100);
      if (iutest_ar_7._36_4_ == 0) {
        iutest_ar_7._36_4_ = 0;
      }
    }
  }
  std::__cxx11::u16string::~u16string((u16string *)local_68);
  std::__cxx11::u16string::~u16string((u16string *)local_30);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrTest, NeString)
{
    typename TestFixture::String test = TestFixture::Text::test;
    typename TestFixture::String Test = TestFixture::Text::Test;
    IUTEST_INFORM_STRNE(test, Test);
    IUTEST_INFORM_STRNE(TestFixture::Text::test, Test);
    IUTEST_INFORM_STRNE(test, TestFixture::Text::Test);

    IUTEST_EXPECT_STRNE(test, Test);
    IUTEST_EXPECT_STRNE(TestFixture::Text::test, Test);
    IUTEST_EXPECT_STRNE(test, TestFixture::Text::Test);

    IUTEST_ASSERT_STRNE(test, Test);
    IUTEST_ASSERT_STRNE(TestFixture::Text::test, Test);
    IUTEST_ASSERT_STRNE(test, TestFixture::Text::Test);
}